

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.h
# Opt level: O0

bool Kumu::apply_visitor<Kumu::AttributeVisitor>(XMLElement *element,AttributeVisitor *visitor)

{
  bool bVar1;
  reference ppXVar2;
  _Self local_40;
  _List_node_base *local_38;
  _List_const_iterator<Kumu::XMLElement_*> local_30;
  const_iterator i;
  ElementList *l;
  AttributeVisitor *visitor_local;
  XMLElement *element_local;
  
  i._M_node = (_List_node_base *)XMLElement::GetChildren_abi_cxx11_(element);
  std::_List_const_iterator<Kumu::XMLElement_*>::_List_const_iterator(&local_30);
  local_38 = (_List_node_base *)
             std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::begin
                       (i._M_node);
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<Kumu::XMLElement_*,_std::allocator<Kumu::XMLElement_*>_>::end(i._M_node)
    ;
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) {
      return true;
    }
    ppXVar2 = std::_List_const_iterator<Kumu::XMLElement_*>::operator*(&local_30);
    bVar1 = AttributeVisitor::Element(visitor,*ppXVar2);
    if (!bVar1) break;
    ppXVar2 = std::_List_const_iterator<Kumu::XMLElement_*>::operator*(&local_30);
    bVar1 = apply_visitor<Kumu::AttributeVisitor>(*ppXVar2,visitor);
    if (!bVar1) {
      return false;
    }
    std::_List_const_iterator<Kumu::XMLElement_*>::operator++(&local_30);
  }
  return false;
}

Assistant:

bool
    apply_visitor(const XMLElement& element, VisitorType& visitor)
    {
      const ElementList& l = element.GetChildren();
      ElementList::const_iterator i;
      
      for ( i = l.begin(); i != l.end(); ++i )
	{
	  if ( ! visitor.Element(**i) )
	    {
	      return false;
	    }

	  if ( ! apply_visitor(**i, visitor) )
	    {
	      return false;
	    }
	}

      return true;
    }